

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QList<QGraphicsItem_*> * __thiscall
QGraphicsViewPrivate::findItems
          (QGraphicsViewPrivate *this,QRegion *exposedRegion,bool *allItems,
          QTransform *viewTransform)

{
  bool bVar1;
  int iVar2;
  QRectF *rect;
  ulong uVar3;
  QRect *this_00;
  undefined1 *in_RCX;
  QGraphicsViewPrivate *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRect *r;
  const_iterator __end1;
  const_iterator __begin1;
  QRegion *__range1;
  bool simpleRectLookup;
  QGraphicsView *q;
  QPainterPath exposedScenePath;
  QRegion adjustedRegion;
  QRectF exposedRegionSceneBounds;
  QRect *rect_00;
  QRect *in_stack_ffffffffffffff00;
  QRect *in_stack_ffffffffffffff08;
  QRect *local_f0;
  QPainterPath local_a8 [8];
  undefined1 *local_a0;
  QRect local_98;
  QRegion local_88 [5];
  undefined1 local_60 [16];
  QRect local_50;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  rect_00 = in_RDI;
  rect = (QRectF *)q_func(in_RSI);
  local_28 = 0xffffffffffffffff;
  local_20 = 0xffffffffffffffff;
  local_18 = 0xffffffffffffffff;
  local_10 = 0xffffffffffffffff;
  local_60 = QRegion::boundingRect();
  local_50 = QRect::adjusted(in_stack_ffffffffffffff08,
                             (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                             (int)in_stack_ffffffffffffff00,(int)((ulong)in_RSI >> 0x20),(int)in_RSI
                            );
  QGraphicsView::mapToScene((QGraphicsView *)rect,rect_00);
  QPolygonF::boundingRect();
  QPolygonF::~QPolygonF((QPolygonF *)0xa36db8);
  QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa36dc9);
  QGraphicsScene::sceneRect((QGraphicsScene *)rect_00);
  uVar3 = QRectF::contains((QRectF *)&local_28);
  if ((uVar3 & 1) == 0) {
    iVar2 = QRegion::rectCount();
    bVar1 = false;
    if (iVar2 == 1) {
      iVar2 = QTransform::type();
      bVar1 = iVar2 < 3;
    }
    if (bVar1) {
      QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa36e75);
      QGraphicsScene::items
                ((QGraphicsScene *)in_RSI,rect,(ItemSelectionMode)((ulong)rect_00 >> 0x20),
                 (SortOrder)rect_00,(QTransform *)in_RDI);
    }
    else {
      local_88[0].d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(local_88);
      local_f0 = (QRect *)QRegion::begin();
      this_00 = (QRect *)QRegion::end();
      for (; local_f0 != this_00; local_f0 = local_f0 + 1) {
        in_stack_ffffffffffffff00 = local_f0;
        local_98 = QRect::adjusted(this_00,(int)((ulong)local_f0 >> 0x20),(int)local_f0,
                                   (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
        QRegion::operator+=(local_88,(QRect *)&local_98);
      }
      local_a0 = &DAT_aaaaaaaaaaaaaaaa;
      qt_regionToPath((QRegion *)local_a8);
      QGraphicsView::mapToScene((QGraphicsView *)in_stack_ffffffffffffff00,(QPainterPath *)in_RSI);
      QPainterPath::~QPainterPath(local_a8);
      QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa36fc9);
      QGraphicsScene::items
                ((QGraphicsScene *)in_RSI,(QPainterPath *)rect,
                 (ItemSelectionMode)((ulong)rect_00 >> 0x20),(SortOrder)rect_00,(QTransform *)in_RDI
                );
      QPainterPath::~QPainterPath((QPainterPath *)&local_a0);
      QRegion::~QRegion(local_88);
    }
  }
  else {
    *in_RCX = 1;
    QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa36e0d);
    QGraphicsScene::items((QGraphicsScene *)rect_00,(SortOrder)((ulong)in_RDI >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QGraphicsItem_*> *)rect_00;
  }
  __stack_chk_fail();
}

Assistant:

QList<QGraphicsItem *> QGraphicsViewPrivate::findItems(const QRegion &exposedRegion, bool *allItems,
                                                       const QTransform &viewTransform) const
{
    Q_Q(const QGraphicsView);

    // Step 1) If all items are contained within the expose region, then
    // return a list of all visible items. ### the scene's growing bounding
    // rect does not take into account untransformable items.
    const QRectF exposedRegionSceneBounds = q->mapToScene(exposedRegion.boundingRect().adjusted(-1, -1, 1, 1))
                                            .boundingRect();
    if (exposedRegionSceneBounds.contains(scene->sceneRect())) {
        Q_ASSERT(allItems);
        *allItems = true;

        // All items are guaranteed within the exposed region.
        return scene->items(Qt::AscendingOrder);
    }

    // Step 2) If the expose region is a simple rect and the view is only
    // translated or scaled, search for items using
    // QGraphicsScene::items(QRectF).
    bool simpleRectLookup =  exposedRegion.rectCount() == 1 && matrix.type() <= QTransform::TxScale;
    if (simpleRectLookup) {
        return scene->items(exposedRegionSceneBounds,
                            Qt::IntersectsItemBoundingRect,
                            Qt::AscendingOrder, viewTransform);
    }

    // If the region is complex or the view has a complex transform, adjust
    // the expose region, convert it to a path, and then search for items
    // using QGraphicsScene::items(QPainterPath);
    QRegion adjustedRegion;
    for (const QRect &r : exposedRegion)
        adjustedRegion += r.adjusted(-1, -1, 1, 1);

    const QPainterPath exposedScenePath(q->mapToScene(qt_regionToPath(adjustedRegion)));
    return scene->items(exposedScenePath, Qt::IntersectsItemBoundingRect,
                        Qt::AscendingOrder, viewTransform);
}